

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void __thiscall ctemplate::BaseArena::set_handle_alignment(BaseArena *this,int align)

{
  vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
  *pvVar1;
  bool bVar2;
  AllocatedBlock *pAVar3;
  void *__dest;
  uint uVar4;
  int iVar5;
  size_t in_RCX;
  ulong __n;
  undefined4 in_register_00000034;
  uint *last_alloc;
  
  last_alloc = (uint *)CONCAT44(in_register_00000034,align);
  if ((align < 1) || ((align + 0x7fffffffU & align) != 0)) {
    set_handle_alignment();
LAB_0012f718:
    set_handle_alignment();
  }
  else {
    in_RCX = (size_t)(uint)align;
    if (in_RCX < this->block_size_) {
      if (this->block_size_ % in_RCX != 0) goto LAB_0012f722;
      if (this->freestart_ == this->freestart_when_empty_) {
        pvVar1 = this->overflow_blocks_;
        if (pvVar1 == (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                       *)0x0) {
          iVar5 = 0;
        }
        else {
          iVar5 = (int)((ulong)((long)(pvVar1->
                                      super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pvVar1->
                                     super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                                     )._M_impl.super__Vector_impl_data._M_start) >> 4);
        }
        uVar4 = iVar5 + this->blocks_alloced_;
        in_RCX = (size_t)uVar4;
        if (uVar4 == 1) {
          this->handle_alignment_ = align;
          iVar5 = -1;
          do {
            iVar5 = iVar5 + 1;
          } while (1 << ((byte)iVar5 & 0x1f) < align);
          this->handle_alignment_bits_ = iVar5;
          return;
        }
      }
      goto LAB_0012f718;
    }
  }
  set_handle_alignment();
LAB_0012f722:
  set_handle_alignment();
  if ((ulong)*last_alloc == 0xffffffff) {
    HandleToPointer();
  }
  else {
    in_RCX = this->block_size_bits_ & 0xffffffff;
    last_alloc = (uint *)(((ulong)*last_alloc << ((byte)this->handle_alignment_bits_ & 0x3f)) >>
                         ((byte)in_RCX & 0x3f));
    pAVar3 = IndexToBlock(this,(int)last_alloc);
    if (pAVar3 != (AllocatedBlock *)0x0) {
      return;
    }
  }
  HandleToPointer();
  bVar2 = AdjustLastAlloc(this,last_alloc,in_RCX);
  if ((__n < in_RCX) && (!bVar2)) {
    __dest = GetMemory(this,in_RCX,1);
    memcpy(__dest,last_alloc,__n);
    return;
  }
  return;
}

Assistant:

void BaseArena::set_handle_alignment(int align) {
  CHECK(align > 0 && 0 == (align & (align - 1)));  // must be power of 2
  CHECK(static_cast<size_t>(align) < block_size_);
  CHECK((block_size_ % align) == 0);
  CHECK(is_empty());
  handle_alignment_ = align;
  handle_alignment_bits_ = 0;
  while ((1 << handle_alignment_bits_) < handle_alignment_) {
    ++handle_alignment_bits_;
  }
}